

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaMan.c
# Opt level: O3

Vec_Int_t * Gia_ManDfsRequireds(Gia_Man_t *p,Vec_Int_t *vObjs,int ReqTime)

{
  uint uVar1;
  int iVar2;
  Tim_Man_t *p_00;
  Gia_Obj_t *pGVar3;
  int *piVar4;
  Gia_Obj_t *pGVar5;
  bool bVar6;
  int iVar7;
  uint uVar8;
  int iVar9;
  Vec_Int_t *pVVar10;
  int *__s;
  Vec_Int_t *pVVar11;
  undefined8 uVar12;
  ulong uVar13;
  uint uVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  long lVar18;
  long lVar19;
  float fVar20;
  
  p_00 = (Tim_Man_t *)p->pManTime;
  uVar1 = p->nObjs;
  pVVar10 = (Vec_Int_t *)malloc(0x10);
  uVar8 = 0x10;
  if (0xe < uVar1 - 1) {
    uVar8 = uVar1;
  }
  pVVar10->nCap = uVar8;
  if (uVar8 == 0) {
    pVVar10->pArray = (int *)0x0;
    pVVar10->nSize = uVar1;
  }
  else {
    __s = (int *)malloc((long)(int)uVar8 << 2);
    pVVar10->pArray = __s;
    pVVar10->nSize = uVar1;
    if (__s != (int *)0x0) {
      memset(__s,0xff,(long)(int)uVar1 << 2);
      goto LAB_0021a8e1;
    }
  }
  __s = (int *)0x0;
LAB_0021a8e1:
  if ((int)uVar1 < 1) {
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                  ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
  }
  *__s = 0;
  pVVar11 = p->vCos;
  iVar9 = pVVar11->nSize;
  if (p_00 == (Tim_Man_t *)0x0) {
    if (0 < iVar9) {
      piVar4 = pVVar11->pArray;
      lVar19 = 0;
      do {
        uVar8 = piVar4[lVar19];
        if (((long)(int)uVar8 < 0) || (uVar1 <= uVar8)) goto LAB_0021ae27;
        if (p->pObjs == (Gia_Obj_t *)0x0) break;
        uVar8 = uVar8 - (*(uint *)(p->pObjs + (int)uVar8) & 0x1fffffff);
        if (((int)uVar8 < 0) || (uVar1 <= uVar8)) goto LAB_0021ae46;
        if (__s[uVar8] == -1 || ReqTime < __s[uVar8]) {
          __s[uVar8] = ReqTime;
          iVar9 = pVVar11->nSize;
        }
        lVar19 = lVar19 + 1;
      } while (lVar19 < iVar9);
    }
  }
  else {
    iVar7 = Tim_ManPoNum(p_00);
    Tim_ManIncrementTravId(p_00);
    pVVar11 = p->vCos;
    if (0 < pVVar11->nSize) {
      lVar19 = 0;
      do {
        iVar2 = pVVar11->pArray[lVar19];
        if (((long)iVar2 < 0) || (p->nObjs <= iVar2)) goto LAB_0021ae27;
        if (p->pObjs == (Gia_Obj_t *)0x0) break;
        if (iVar9 - iVar7 <= lVar19) {
          pGVar5 = p->pObjs + iVar2;
          Tim_ManSetCoRequired(p_00,(int)lVar19,(float)ReqTime);
          pGVar3 = p->pObjs;
          if ((pGVar5 < pGVar3) || (pGVar3 + p->nObjs <= pGVar5)) {
LAB_0021ae65:
            __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                          ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
          }
          uVar8 = (int)((ulong)((long)pGVar5 - (long)pGVar3) >> 2) * -0x55555555 -
                  (*(uint *)pGVar5 & 0x1fffffff);
          if (uVar1 <= uVar8) goto LAB_0021ae46;
          if (__s[uVar8] == -1 || ReqTime < __s[uVar8]) {
            __s[uVar8] = ReqTime;
          }
        }
        lVar19 = lVar19 + 1;
        pVVar11 = p->vCos;
      } while (lVar19 < pVVar11->nSize);
    }
  }
  lVar19 = (long)vObjs->nSize;
  if (0 < (long)vObjs->nSize) {
    do {
      if (vObjs->nSize < lVar19) {
LAB_0021ae08:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      uVar8 = vObjs->pArray[lVar19 + -1];
      lVar18 = (long)(int)uVar8;
      if (lVar18 < 0) {
        uVar8 = ~uVar8;
        iVar9 = Tim_ManBoxOutputFirst(p_00,uVar8);
        uVar14 = Tim_ManBoxOutputNum(p_00,uVar8);
        if (0 < (int)uVar14) {
          lVar18 = (long)iVar9;
          uVar13 = (ulong)uVar14;
          do {
            if ((iVar9 < 0) || (p->vCis->nSize <= lVar18)) goto LAB_0021ae08;
            iVar7 = p->vCis->pArray[lVar18];
            lVar15 = (long)iVar7;
            if ((lVar15 < 0) || (p->nObjs <= iVar7)) goto LAB_0021ae27;
            if ((int)uVar1 <= iVar7) goto LAB_0021ae08;
            iVar7 = __s[lVar15];
            if (__s[lVar15] == -1) {
              iVar7 = ReqTime;
            }
            if (iVar7 < 0) {
              __assert_fail("Req >= 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaMan.c"
                            ,0x440,"Vec_Int_t *Gia_ManDfsRequireds(Gia_Man_t *, Vec_Int_t *, int)");
            }
            if (-1 < (int)*(undefined8 *)(p->pObjs + lVar15)) goto LAB_0021ae84;
            Tim_ManSetCiRequired
                      (p_00,(uint)((ulong)*(undefined8 *)(p->pObjs + lVar15) >> 0x20) & 0x1fffffff,
                       (float)iVar7);
            lVar18 = lVar18 + 1;
            uVar13 = uVar13 - 1;
          } while (uVar13 != 0);
        }
        iVar9 = Tim_ManBoxInputFirst(p_00,uVar8);
        uVar8 = Tim_ManBoxInputNum(p_00,uVar8);
        if (0 < (int)uVar8) {
          lVar18 = (long)iVar9;
          uVar13 = (ulong)uVar8;
          do {
            if ((iVar9 < 0) || (p->vCos->nSize <= lVar18)) goto LAB_0021ae08;
            iVar7 = p->vCos->pArray[lVar18];
            lVar15 = (long)iVar7;
            if ((lVar15 < 0) || (p->nObjs <= iVar7)) goto LAB_0021ae27;
            pGVar5 = p->pObjs;
            uVar12 = *(undefined8 *)(pGVar5 + lVar15);
            if (-1 < (int)uVar12) {
LAB_0021ae84:
              __assert_fail("pObj->fTerm",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                            ,0x1da,"int Gia_ObjCioId(Gia_Obj_t *)");
            }
            fVar20 = Tim_ManGetCoRequired(p_00,(uint)((ulong)uVar12 >> 0x20) & 0x1fffffff);
            iVar7 = (int)fVar20;
            if (iVar7 < 0) {
              __assert_fail("Req >= 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaMan.c"
                            ,0x44a,"Vec_Int_t *Gia_ManDfsRequireds(Gia_Man_t *, Vec_Int_t *, int)");
            }
            pGVar5 = pGVar5 + lVar15;
            pGVar3 = p->pObjs;
            if ((pGVar5 < pGVar3) || (pGVar3 + p->nObjs <= pGVar5)) goto LAB_0021ae65;
            uVar8 = (int)((ulong)((long)pGVar5 - (long)pGVar3) >> 2) * -0x55555555 -
                    (*(uint *)pGVar5 & 0x1fffffff);
            if (uVar1 <= uVar8) goto LAB_0021ae46;
            if ((__s[uVar8] == -1) || (iVar7 < __s[uVar8])) {
              __s[uVar8] = iVar7;
            }
            lVar18 = lVar18 + 1;
            uVar13 = uVar13 - 1;
          } while (uVar13 != 0);
        }
      }
      else {
        if (uVar8 == 0) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaMan.c"
                        ,0x45f,"Vec_Int_t *Gia_ManDfsRequireds(Gia_Man_t *, Vec_Int_t *, int)");
        }
        if ((int)uVar1 <= (int)uVar8) goto LAB_0021ae08;
        if (__s[lVar18] < 10) {
          __assert_fail("Req >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaMan.c"
                        ,0x451,"Vec_Int_t *Gia_ManDfsRequireds(Gia_Man_t *, Vec_Int_t *, int)");
        }
        iVar9 = __s[lVar18] + -10;
        pVVar11 = p->vMapping;
        if (pVVar11 == (Vec_Int_t *)0x0) {
          if (p->nObjs <= (int)uVar8) {
LAB_0021ae27:
            __assert_fail("v >= 0 && v < p->nObjs",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                          ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
          }
          pGVar5 = p->pObjs;
          uVar12 = *(undefined8 *)(pGVar5 + lVar18);
          uVar14 = uVar8 - ((uint)uVar12 & 0x1fffffff);
          if (((int)uVar14 < 0) || (uVar1 <= uVar14)) {
LAB_0021ae46:
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                          ,0x1ba,"int *Vec_IntEntryP(Vec_Int_t *, int)");
          }
          if ((__s[uVar14] == -1) || (iVar9 < __s[uVar14])) {
            __s[uVar14] = iVar9;
            uVar12 = *(undefined8 *)(pGVar5 + lVar18);
          }
          uVar8 = uVar8 - ((uint)((ulong)uVar12 >> 0x20) & 0x1fffffff);
          if (((int)uVar8 < 0) || (uVar1 <= uVar8)) goto LAB_0021ae46;
          if ((__s[uVar8] == -1) || (iVar9 < __s[uVar8])) {
            __s[uVar8] = iVar9;
          }
        }
        else {
          uVar14 = pVVar11->nSize;
          if ((int)uVar14 <= (int)uVar8) goto LAB_0021ae08;
          piVar4 = pVVar11->pArray;
          if (piVar4[lVar18] == 0) {
            __assert_fail("Gia_ObjIsLut(p, Entry)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaMan.c"
                          ,0x454,"Vec_Int_t *Gia_ManDfsRequireds(Gia_Man_t *, Vec_Int_t *, int)");
          }
          lVar15 = 0;
          while( true ) {
            lVar16 = (long)piVar4[lVar18];
            if ((lVar16 < 0) || (uVar14 <= (uint)piVar4[lVar18])) goto LAB_0021ae08;
            if (piVar4[lVar16] <= lVar15) break;
            lVar17 = (long)piVar4[lVar16 + lVar15 + 1];
            if ((lVar17 < 0) || (uVar1 <= (uint)piVar4[lVar16 + lVar15 + 1])) goto LAB_0021ae46;
            if ((__s[lVar17] == -1) || (iVar9 < __s[lVar17])) {
              __s[lVar17] = iVar9;
              uVar14 = pVVar11->nSize;
            }
            lVar15 = lVar15 + 1;
            if ((int)uVar14 <= (int)uVar8) goto LAB_0021ae08;
          }
        }
      }
      bVar6 = 1 < lVar19;
      lVar19 = lVar19 + -1;
    } while (bVar6);
  }
  return pVVar10;
}

Assistant:

Vec_Int_t * Gia_ManDfsRequireds( Gia_Man_t * p, Vec_Int_t * vObjs, int ReqTime )
{
    Tim_Man_t * pManTime = (Tim_Man_t *)p->pManTime;
    Vec_Int_t * vTimes = Vec_IntStartFull( Gia_ManObjNum(p) );
    Gia_Obj_t * pObj; 
    int j, Entry, k, iFan, Req;
    Vec_IntWriteEntry( vTimes, 0, 0 );
    if ( pManTime ) 
    {
        int nCoLimit = Gia_ManCoNum(p) - Tim_ManPoNum(pManTime);
        Tim_ManIncrementTravId( pManTime );
        //Tim_ManInitPoRequiredAll( pManTime, (float)ReqTime );
        Gia_ManForEachCo( p, pObj, j )
            if ( j >= nCoLimit )
            {
                Tim_ManSetCoRequired( pManTime, j, ReqTime );
                Gia_ManDfsUpdateRequired( vTimes, Gia_ObjFaninId0p(p, pObj), ReqTime );
            }
    }
    else
    {
        Gia_ManForEachCo( p, pObj, j )
            Gia_ManDfsUpdateRequired( vTimes, Gia_ObjFaninId0p(p, pObj), ReqTime );
    }
    Vec_IntForEachEntryReverse( vObjs, Entry, j )
    {
        if ( Entry < 0 ) // box
        {
            int iFirst, nTerms, iBox = -Entry-1;
            assert( iBox >= 0 );
            // set requireds for box outputs
            iFirst = Tim_ManBoxOutputFirst( pManTime, iBox );
            nTerms = Tim_ManBoxOutputNum( pManTime, iBox );
            for ( k = 0; k < nTerms; k++ )
            {
                pObj = Gia_ManCi( p, iFirst + k );
                Req  = Vec_IntEntry( vTimes, Gia_ObjId(p, pObj) );
                Req  = Req == -1 ? ReqTime : Req; // dangling box output
                assert( Req >= 0 );
                Tim_ManSetCiRequired( pManTime, Gia_ObjCioId(pObj), Req );
            }
            // derive requireds for box inputs
            iFirst = Tim_ManBoxInputFirst( pManTime, iBox );
            nTerms = Tim_ManBoxInputNum( pManTime, iBox );
            for ( k = 0; k < nTerms; k++ )
            {
                pObj = Gia_ManCo( p, iFirst + k );
                Req  = Tim_ManGetCoRequired( pManTime, Gia_ObjCioId(pObj) );
                assert( Req >= 0 );
                Gia_ManDfsUpdateRequired( vTimes, Gia_ObjFaninId0p(p, pObj), Req );
            }
        }
        else if ( Entry > 0 ) // node
        {
            Req = Vec_IntEntry(vTimes, Entry) - 10;
            assert( Req >= 0 );
            if ( Gia_ManHasMapping(p) )
            {
                assert( Gia_ObjIsLut(p, Entry) );
                Gia_LutForEachFanin( p, Entry, iFan, k )
                    Gia_ManDfsUpdateRequired( vTimes, iFan, Req );
            }
            else
            {
                pObj  = Gia_ManObj( p, Entry );
                Gia_ManDfsUpdateRequired( vTimes, Gia_ObjFaninId0(pObj, Entry), Req );
                Gia_ManDfsUpdateRequired( vTimes, Gia_ObjFaninId1(pObj, Entry), Req );
            }
        }
        else assert( 0 );
    }
    return vTimes;
}